

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O3

void __thiscall ON_Matrix::Zero(ON_Matrix *this)

{
  int *piVar1;
  
  for (piVar1 = (int *)this->m_cmem; piVar1 != (int *)0x0; piVar1 = *(int **)(piVar1 + 4)) {
    if ((*(void **)(piVar1 + 2) != (void *)0x0) && (0 < (long)*piVar1)) {
      memset(*(void **)(piVar1 + 2),0,(long)*piVar1 << 3);
    }
    onmalloc(0);
  }
  return;
}

Assistant:

void ON_Matrix::Zero()
{
  struct DBLBLK* cmem = (struct DBLBLK*)m_cmem;
  while ( 0 != cmem )
  {
    if ( 0 != cmem->a && cmem->count > 0 )
    {
      memset( cmem->a, 0, cmem->count*sizeof(cmem->a[0]) );
    }
    onmalloc(0);  // allow canceling
    cmem = cmem->next;
  }

  //m_a.Zero();
}